

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_player(void)

{
  int iVar1;
  char *pcVar2;
  equip_slot *peVar3;
  player_class *local_80;
  player_class *c;
  player_shape *s;
  player_race *r;
  char buf [80];
  int local_10;
  uint8_t stat_max;
  uint8_t num;
  wchar_t wStack_c;
  uint8_t tmp8u;
  wchar_t i;
  
  buf[0x4d] = '\0';
  rd_string(player->full_name,0x20);
  rd_string(player->died_from,0x50);
  pcVar2 = (char *)mem_zalloc(0xfa);
  player->history = pcVar2;
  rd_string(player->history,0xfa);
  rd_string((char *)&r,0x50);
  for (s = (player_shape *)races; s != (player_shape *)0x0; s = s->next) {
    iVar1 = strcmp(s->name,(char *)&r);
    if (iVar1 == 0) {
      player->race = (player_race *)s;
      break;
    }
  }
  if (player->race == (player_race *)0x0) {
    pcVar2 = format("Invalid player race (%s).",&r);
    note(pcVar2);
    wStack_c = L'\xffffffff';
  }
  else {
    rd_string((char *)&r,0x50);
    for (c = (player_class *)shapes; c != (player_class *)0x0; c = c->next) {
      iVar1 = strcmp(c->name,(char *)&r);
      if (iVar1 == 0) {
        player->shape = (player_shape *)c;
        break;
      }
    }
    if (player->shape == (player_shape *)0x0) {
      pcVar2 = format("Invalid player shape (%s).",&r);
      note(pcVar2);
      wStack_c = L'\xffffffff';
    }
    else {
      rd_string((char *)&r,0x50);
      for (local_80 = classes; local_80 != (player_class *)0x0; local_80 = local_80->next) {
        iVar1 = strcmp(local_80->name,(char *)&r);
        if (iVar1 == 0) {
          player->class = local_80;
          break;
        }
      }
      if (player->class == (player_class *)0x0) {
        pcVar2 = format("Invalid player class (%s).",&r);
        note(pcVar2);
        wStack_c = L'\xffffffff';
      }
      else {
        rd_byte(&(player->opts).name_suffix);
        rd_byte(&player->hitdie);
        rd_byte(&player->expfact);
        rd_s16b(&player->age);
        rd_s16b(&player->ht);
        rd_s16b(&player->wt);
        rd_byte((uint8_t *)(buf + 0x4d));
        if ((byte)buf[0x4d] < 6) {
          for (local_10 = 0; local_10 < (int)(uint)(byte)buf[0x4d]; local_10 = local_10 + 1) {
            rd_s16b(player->stat_max + local_10);
          }
          for (local_10 = 0; local_10 < (int)(uint)(byte)buf[0x4d]; local_10 = local_10 + 1) {
            rd_s16b(player->stat_cur + local_10);
          }
          for (local_10 = 0; local_10 < (int)(uint)(byte)buf[0x4d]; local_10 = local_10 + 1) {
            rd_s16b(player->stat_map + local_10);
          }
          for (local_10 = 0; local_10 < (int)(uint)(byte)buf[0x4d]; local_10 = local_10 + 1) {
            rd_s16b(player->stat_birth + local_10);
          }
          rd_s16b(&player->ht_birth);
          rd_s16b(&player->wt_birth);
          strip_bytes(2);
          rd_s32b(&player->au_birth);
          rd_string((char *)&r,0x50);
          pcVar2 = string_make((char *)&r);
          (player->body).name = pcVar2;
          rd_u16b(&(player->body).count);
          if (z_info->equip_slots_max < (player->body).count) {
            pcVar2 = format("Too many (%u) body parts!",(ulong)(player->body).count);
            note(pcVar2);
            wStack_c = L'\xffffffff';
          }
          else {
            peVar3 = (equip_slot *)mem_zalloc((ulong)(player->body).count << 5);
            (player->body).slots = peVar3;
            for (local_10 = 0; local_10 < (int)(uint)(player->body).count; local_10 = local_10 + 1)
            {
              rd_u16b(&(player->body).slots[local_10].type);
              rd_string((char *)&r,0x50);
              pcVar2 = string_make((char *)&r);
              (player->body).slots[local_10].name = pcVar2;
            }
            strip_bytes(4);
            rd_s32b(&player->au);
            rd_s32b(&player->max_exp);
            rd_s32b(&player->exp);
            rd_u16b(&player->exp_frac);
            rd_s16b(&player->lev);
            if ((player->lev < 1) || (0x32 < player->lev)) {
              pcVar2 = format("Invalid player level (%d).",(ulong)(uint)(int)player->lev);
              note(pcVar2);
              wStack_c = L'\xffffffff';
            }
            else {
              rd_s16b(&player->mhp);
              rd_s16b(&player->chp);
              rd_u16b(&player->chp_frac);
              rd_s16b(&player->msp);
              rd_s16b(&player->csp);
              rd_u16b(&player->csp_frac);
              rd_s16b(&player->max_lev);
              rd_s16b(&player->max_depth);
              rd_s16b(&player->recall_depth);
              if (player->max_lev < player->lev) {
                player->max_lev = player->lev;
              }
              if (player->max_depth < 0) {
                player->max_depth = 1;
              }
              if (player->recall_depth < 1) {
                player->recall_depth = player->max_depth;
              }
              if (-1 < player->chp) {
                my_strcpy(player->died_from,"(alive and well)",0x50);
              }
              rd_byte((uint8_t *)(buf + 0x4f));
              (player->old_grid).y = (uint)(byte)buf[0x4f];
              rd_byte((uint8_t *)(buf + 0x4f));
              (player->old_grid).x = (uint)(byte)buf[0x4f];
              strip_bytes(4);
              rd_byte(&player->skip_cmd_coercion);
              rd_byte(&player->unignoring);
              rd_s16b(&player->deep_descent);
              rd_s16b(&player->energy);
              rd_s16b(&player->word_recall);
              rd_byte((uint8_t *)(buf + 0x4e));
              if ((byte)buf[0x4e] < 0x36) {
                for (local_10 = 0; local_10 < (int)(uint)(byte)buf[0x4e]; local_10 = local_10 + 1) {
                  rd_s16b(player->timed + local_10);
                }
                if ((byte)buf[0x4e] < 0x35) {
                  memset(player->timed + (int)(uint)(byte)buf[0x4e],0,
                         (long)(int)(0x35 - (uint)(byte)buf[0x4e]) << 1);
                }
              }
              else {
                for (local_10 = 0; local_10 < 0x35; local_10 = local_10 + 1) {
                  rd_s16b(player->timed + local_10);
                }
                strip_bytes(((byte)buf[0x4e] - 0x35) * 2);
                note("Discarded unsupported timed effects");
              }
              rd_u32b(&player->total_energy);
              rd_u32b(&player->resting_turn);
              strip_bytes(0x20);
              wStack_c = L'\0';
            }
          }
        }
        else {
          pcVar2 = format("Too many stats (%d).",(ulong)(byte)buf[0x4d]);
          note(pcVar2);
          wStack_c = L'\xffffffff';
        }
      }
    }
  }
  return wStack_c;
}

Assistant:

int rd_player(void)
{
	int i;
	uint8_t tmp8u, num;
	uint8_t stat_max = 0;
	char buf[80];
	struct player_race *r;
	struct player_shape *s;
	struct player_class *c;

	rd_string(player->full_name, sizeof(player->full_name));
	rd_string(player->died_from, 80);
	player->history = mem_zalloc(250);
	rd_string(player->history, 250);

	/* Player race */
	rd_string(buf, sizeof(buf));
	for (r = races; r; r = r->next) {
		if (streq(r->name, buf)) {
			player->race = r;
			break;
		}
	}

	/* Verify player race */
	if (!player->race) {
		note(format("Invalid player race (%s).", buf));
		return -1;
	}

	/* Player shape */
	rd_string(buf, sizeof(buf));
	for (s = shapes; s; s = s->next) {
		if (streq(s->name, buf)) {
			player->shape = s;
			break;
		}
	}

	/* If no player shape recorded, set to normal and hope for the best */
	if (!player->shape) {
		note(format("Invalid player shape (%s).", buf));
		return -1;
	}

	/* Player class */
	rd_string(buf, sizeof(buf));
	for (c = classes; c; c = c->next) {
		if (streq(c->name, buf)) {
			player->class = c;
			break;
		}
	}

	if (!player->class) {
		note(format("Invalid player class (%s).", buf));
		return -1;
	}

	/* Numeric name suffix */
	rd_byte(&player->opts.name_suffix);

	/* Special Race/Class info */
	rd_byte(&player->hitdie);
	rd_byte(&player->expfact);

	/* Age/Height/Weight */
	rd_s16b(&player->age);
	rd_s16b(&player->ht);
	rd_s16b(&player->wt);

	/* Read the stat info */
	rd_byte(&stat_max);
	if (stat_max > STAT_MAX) {
		note(format("Too many stats (%d).", stat_max));
		return -1;
	}

	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_max[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_cur[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_map[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_birth[i]);

	rd_s16b(&player->ht_birth);
	rd_s16b(&player->wt_birth);
	strip_bytes(2);
	rd_s32b(&player->au_birth);

	/* Player body */
	rd_string(buf, sizeof(buf));
	player->body.name = string_make(buf);
	rd_u16b(&player->body.count);
	if (player->body.count > z_info->equip_slots_max) {
		note(format("Too many (%u) body parts!", player->body.count));
		return (-1);
	}

	player->body.slots = mem_zalloc(player->body.count *
									sizeof(struct equip_slot));
	for (i = 0; i < player->body.count; i++) {
		rd_u16b(&player->body.slots[i].type);
		rd_string(buf, sizeof(buf));
		player->body.slots[i].name = string_make(buf);
	}

	strip_bytes(4);

	rd_s32b(&player->au);

	rd_s32b(&player->max_exp);
	rd_s32b(&player->exp);
	rd_u16b(&player->exp_frac);

	rd_s16b(&player->lev);

	/* Verify player level */
	if ((player->lev < 1) || (player->lev > PY_MAX_LEVEL)) {
		note(format("Invalid player level (%d).", player->lev));
		return (-1);
	}

	rd_s16b(&player->mhp);
	rd_s16b(&player->chp);
	rd_u16b(&player->chp_frac);

	rd_s16b(&player->msp);
	rd_s16b(&player->csp);
	rd_u16b(&player->csp_frac);

	rd_s16b(&player->max_lev);
	rd_s16b(&player->max_depth);
	rd_s16b(&player->recall_depth);

	/* Hack -- Repair maximum player level */
	if (player->max_lev < player->lev) player->max_lev = player->lev;

	/* Hack -- Repair maximum dungeon level */
	if (player->max_depth < 0) player->max_depth = 1;
	if (player->recall_depth <= 0) player->recall_depth = player->max_depth;

	/* Hack -- Reset cause of death */
	if (player->chp >= 0)
		my_strcpy(player->died_from, "(alive and well)",
				  sizeof(player->died_from));

	/* More info */
	rd_byte(&tmp8u);
	player->old_grid.y = tmp8u;
	rd_byte(&tmp8u);
	player->old_grid.x = tmp8u;
	strip_bytes(4);
	rd_byte(&player->skip_cmd_coercion);
	rd_byte(&player->unignoring);
	rd_s16b(&player->deep_descent);

	/* Read the flags */
	rd_s16b(&player->energy);
	rd_s16b(&player->word_recall);

	/* Find the number of timed effects */
	rd_byte(&num);

	if (num <= TMD_MAX) {
		/* Read all the effects */
		for (i = 0; i < num; i++)
			rd_s16b(&player->timed[i]);

		/* Initialize any entries not read */
		if (num < TMD_MAX)
			memset(player->timed + num, 0, (TMD_MAX - num) * sizeof(int16_t));
	} else {
		/* Probably in trouble anyway */
		for (i = 0; i < TMD_MAX; i++)
			rd_s16b(&player->timed[i]);

		/* Discard unused entries */
		strip_bytes(2 * (num - TMD_MAX));
		note("Discarded unsupported timed effects");
	}

	/* Total energy used so far */
	rd_u32b(&player->total_energy);
	/* # of turns spent resting */
	rd_u32b(&player->resting_turn);

	/* Future use */
	strip_bytes(32);

	return 0;
}